

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReaderTests.cpp
# Opt level: O1

int testMMapFileReaderTestsFileErrorEmpty(void)

{
  string *filename;
  ostream *poVar1;
  AutoDeleteTempFile tempfile;
  AutoDeleteTempFile AStack_88;
  MMapFileReader local_60;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&AStack_88);
  filename = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&AStack_88);
  MILBlob::Blob::MMapFileReader::MMapFileReader(&local_60,filename);
  MILBlob::Blob::MMapFileReader::~MMapFileReader(&local_60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
             ,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,": expected exception, but none thrown.\n",0x27);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&AStack_88);
  return 1;
}

Assistant:

int testMMapFileReaderTestsFileErrorEmpty()
{
    AutoDeleteTempFile tempfile;
    ML_ASSERT_THROWS_WITH_MESSAGE(MMapFileReader(tempfile.GetFilename()), std::runtime_error, "Unable to mmap");

    return 0;
}